

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O2

void demo3(void)

{
  Param param;
  IMLE imleObj;
  
  IMLE::Param::Param(&param,1,1);
  imleObj.d = 1;
  imleObj.D = 0;
  imleObj.param.accelerated = true;
  imleObj.param._9_7_ = 0x3fb99999999999;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (&param.Psi0,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&imleObj);
  param.sigma0 = 1.0;
  param.p0 = 0.3;
  IMLE::IMLE(&imleObj,1,1,&param,0x800);
  doubleCos1D_train<IMLE>(&imleObj,2000);
  doubleCos1D_eval<IMLE>(&imleObj);
  IMLE::~IMLE(&imleObj);
  IMLE::Param::~Param(&param);
  return;
}

Assistant:

void demo3()
{
    int d = 1;    //Input dimension
    int D = 1;    //Output dimension

    //      IMLE Parameters
    IMLE::Param param(d,D);
    param.Psi0 = IMLE::X::Constant(D,0.1);
    param.sigma0 = 1.0;
    param.p0 = 0.3;

    // IMLE object
    IMLE imleObj(d,D,param);

    doubleCos1D_train( imleObj );
    doubleCos1D_eval( imleObj );
}